

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::iterate(CopyImageTest *this)

{
  int iVar1;
  code *pcVar2;
  long lVar3;
  int method;
  long lVar4;
  Iteration iterations [6];
  IterationFunc iteration2 [1];
  IterationFunc iteration6 [2];
  IterationFunc iteration4 [2];
  IterationFunc iteration3 [2];
  IterationFunc iteration5 [3];
  IterationFunc iteration1 [3];
  
  iteration1[1] = 0;
  iteration1[0] = (IterationFunc)logTestInfoIter;
  iteration1[2] = (IterationFunc)createImagesIter;
  iteration2[0] = (IterationFunc)renderDestinationIter;
  iteration3[0] = (IterationFunc)copyImageIter;
  iteration3[1] = 0;
  iteration4[0] = (IterationFunc)verifyDestinationIter;
  iteration4[1] = 0;
  iteration5[1] = 0;
  iteration5[0] = (IterationFunc)createImagesIter;
  iteration5[2] = (IterationFunc)copyImageIter;
  iteration6[0] = (IterationFunc)verifyDestinationIter;
  iteration6[1] = 0;
  iterations[0].methodCount = 3;
  iterations[0].methods = iteration1;
  iterations[1].methodCount = 1;
  iterations[1].methods = iteration2;
  iterations[2].methodCount = 2;
  iterations[2].methods = iteration3;
  iterations[3].methodCount = 2;
  iterations[3].methods = iteration4;
  iterations[4].methodCount = 3;
  iterations[4].methods = iteration5;
  iterations[5].methodCount = 2;
  iterations[5].methods = iteration6;
  lVar3 = 8;
  lVar4 = 0;
  while( true ) {
    iVar1 = this->m_iteration;
    if (iterations[iVar1].methodCount <= lVar4) break;
    pcVar2 = *(code **)((long)iterations[iVar1].methods + lVar3 + -8);
    if (((ulong)pcVar2 & 1) != 0) {
      pcVar2 = *(code **)(pcVar2 + *(long *)((long)&((CopyImageTest *)
                                                    (&((CopyImageTest *)
                                                      (&((CopyImageTest *)
                                                        (&this->m_srcImageInfo + -6))->
                                                        m_srcImageInfo + -6))->m_srcImageInfo + -6))
                                                    ->m_srcImageInfo +
                                            *(long *)((long)iterations[iVar1].methods + lVar3) +
                                            0xffffffffffffff88U) + -1);
    }
    (*pcVar2)();
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x10;
  }
  iVar1 = iVar1 + 1;
  this->m_iteration = iVar1;
  if (5 < iVar1) {
    tcu::ResultCollector::setTestContextResult
              (&this->m_state->results,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  return (uint)(5 >= iVar1);
}

Assistant:

TestCase::IterateResult CopyImageTest::iterate (void)
{
	// Note: Returning from iterate() has two side-effects: it touches
	// watchdog and calls eglSwapBuffers. For the first it's important
	// to keep work per iteration reasonable to avoid
	// timeouts. Because of the latter, it's prudent to do more than
	// trivial amount of work. Otherwise we'll end up waiting for a
	// new buffer in swap, it seems.

	// The split below tries to combine trivial work with actually
	// expensive rendering iterations without having too much
	// rendering in one iteration to avoid timeouts.
	const IterationFunc iteration1[] =
	{
		&CopyImageTest::logTestInfoIter,
		&CopyImageTest::createImagesIter,
		&CopyImageTest::renderSourceIter
	};
	const IterationFunc iteration2[] =
	{
		&CopyImageTest::renderDestinationIter
	};
	const IterationFunc iteration3[] =
	{
		&CopyImageTest::copyImageIter,
		&CopyImageTest::verifySourceIter
	};
	const IterationFunc iteration4[] =
	{
		&CopyImageTest::verifyDestinationIter,
		&CopyImageTest::destroyImagesIter
	};
	const IterationFunc iteration5[] =
	{
		&CopyImageTest::createImagesIter,
		&CopyImageTest::copyImageIter,
		&CopyImageTest::verifySourceIter
	};
	const IterationFunc iteration6[] =
	{
		&CopyImageTest::verifyDestinationIter,
		&CopyImageTest::destroyImagesIter
	};
	const Iteration iterations[] =
	{
		Iteration(DE_LENGTH_OF_ARRAY(iteration1), iteration1),
		Iteration(DE_LENGTH_OF_ARRAY(iteration2), iteration2),
		Iteration(DE_LENGTH_OF_ARRAY(iteration3), iteration3),
		Iteration(DE_LENGTH_OF_ARRAY(iteration4), iteration4),
		Iteration(DE_LENGTH_OF_ARRAY(iteration5), iteration5),
		Iteration(DE_LENGTH_OF_ARRAY(iteration6), iteration6)
	};

	DE_ASSERT(m_iteration < DE_LENGTH_OF_ARRAY(iterations));
	for (int method = 0; method < iterations[m_iteration].methodCount; method++)
		(this->*iterations[m_iteration].methods[method])();

	m_iteration++;

	if (m_iteration < DE_LENGTH_OF_ARRAY(iterations))
	{
		return CONTINUE;
	}
	else
	{
		m_state->results.setTestContextResult(m_testCtx);
		return STOP;
	}
}